

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O0

void __thiscall efsw::FileWatcherInotify::~FileWatcherInotify(FileWatcherInotify *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_38;
  iterator end;
  iterator iter;
  Lock l2;
  Lock l;
  Lock initLock;
  FileWatcherInotify *this_local;
  
  (this->super_FileWatcherImpl)._vptr_FileWatcherImpl =
       (_func_int **)&PTR__FileWatcherInotify_00184c28;
  Atomic<bool>::operator=(&(this->super_FileWatcherImpl).mInitOK,false);
  while ((this->mIsTakingAction & 1U) != 0) {
    usleep(1000);
  }
  Lock::Lock(&l,&this->mInitLock);
  if (this->mThread != (Thread *)0x0) {
    if (this->mThread != (Thread *)0x0) {
      (*this->mThread->_vptr_Thread[1])();
    }
    this->mThread = (Thread *)0x0;
  }
  Lock::Lock(&l2,&this->mWatchesLock);
  Lock::Lock((Lock *)&iter,&this->mRealWatchesLock);
  end = std::
        map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
        ::begin(&this->mWatches);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
       ::end(&this->mWatches);
  while( true ) {
    bVar1 = std::operator!=(&end,&local_38);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator->
                       (&end);
    if (ppVar2->second != (WatcherInotify *)0x0) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator->
                         (&end);
      if (ppVar2->second != (WatcherInotify *)0x0) {
        (*(ppVar2->second->super_Watcher)._vptr_Watcher[1])();
      }
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator->
                         (&end);
      ppVar2->second = (WatcherInotify *)0x0;
    }
    std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator++(&end);
  }
  std::
  map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
  ::clear(&this->mWatches);
  if (this->mFD != -1) {
    close(this->mFD);
    this->mFD = -1;
  }
  Lock::~Lock((Lock *)&iter);
  Lock::~Lock(&l2);
  Lock::~Lock(&l);
  std::
  vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&this->mMovedOutsideWatches);
  Mutex::~Mutex(&this->mInitLock);
  Mutex::~Mutex(&this->mRealWatchesLock);
  Mutex::~Mutex(&this->mWatchesLock);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~unordered_map(&this->mWatchesRef);
  std::
  map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
  ::~map(&this->mRealWatches);
  std::
  map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
  ::~map(&this->mWatches);
  FileWatcherImpl::~FileWatcherImpl(&this->super_FileWatcherImpl);
  return;
}

Assistant:

FileWatcherInotify::~FileWatcherInotify() {
	mInitOK = false;
	// There is deadlock when release FileWatcherInotify instance since its handAction
	// function is still running and hangs in requiring lock without init lock captured.
	while ( mIsTakingAction ) {
		// It'd use condition-wait instead of sleep. Actually efsw has no such
		// implementation so we just skip and sleep while for that to avoid deadlock.
		usleep( 1000 );
	};
	Lock initLock( mInitLock );

	efSAFE_DELETE( mThread );

	Lock l( mWatchesLock );
	Lock l2( mRealWatchesLock );

	WatchMap::iterator iter = mWatches.begin();
	WatchMap::iterator end = mWatches.end();

	for ( ; iter != end; ++iter ) {
		efSAFE_DELETE( iter->second );
	}

	mWatches.clear();

	if ( mFD != -1 ) {
		close( mFD );
		mFD = -1;
	}
}